

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmetadata_p.h
# Opt level: O2

QDateTime __thiscall QFileSystemMetaData::fileTime(QFileSystemMetaData *this,FileTime time)

{
  undefined4 in_EDX;
  
  switch(in_EDX) {
  case 0:
    accessTime(this);
    break;
  case 1:
    birthTime(this);
    break;
  case 2:
    metadataChangeTime(this);
    break;
  case 3:
    modificationTime(this);
    break;
  default:
    QDateTime::QDateTime((QDateTime *)this);
  }
  return (QDateTime)(Data)this;
}

Assistant:

inline QDateTime QFileSystemMetaData::fileTime(QFile::FileTime time) const
{
    switch (time) {
    case QFile::FileModificationTime:
        return modificationTime();

    case QFile::FileAccessTime:
        return accessTime();

    case QFile::FileBirthTime:
        return birthTime();

    case QFile::FileMetadataChangeTime:
        return metadataChangeTime();
    }

    return QDateTime();
}